

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleQualifierRenderCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  ulong uVar1;
  ostringstream buf;
  ContextType local_1b4;
  string local_1b0;
  undefined1 local_190 [376];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}",0x41);
  uVar1 = (ulong)*(uint *)((long)this + 0xbc);
  if (uVar1 < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01c8a4b0 + *(int *)(&DAT_01c8a4b0 + uVar1 * 4),
               *(long *)(&DAT_01c8a4c8 + uVar1 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "layout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n",0x44);
  uVar1 = (ulong)*(uint *)((long)this + 0xbc);
  if (uVar1 < 6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,&DAT_01c8a468 + *(int *)(&DAT_01c8a468 + uVar1 * 4),
               *(long *)(&DAT_01c8a480 + uVar1 * 8));
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,
             "\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tif (fract(field) > 0.5)\n\t\tfragColor = vec4(0.0, 0.0, 0.0, 1.0);\n}"
             ,0x6a);
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string	SampleQualifierRenderCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}";

	if (m_iteration == 0)
		buf << "sample in highp float v_input;\n";
	else if (m_iteration == 1)
		buf << "sample in highp vec2 v_input;\n";
	else if (m_iteration == 2)
		buf << "sample in highp vec3 v_input;\n";
	else if (m_iteration == 3)
		buf << "sample in highp vec4 v_input;\n";
	else if (m_iteration == 4)
		buf << "sample in highp float[2] v_input;\n";
	else if (m_iteration == 5)
		buf << "struct VaryingStruct { highp float a; highp float b; };\n"
			   "sample in VaryingStruct v_input;\n";
	else
		DE_ASSERT(false);

	buf <<	"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n";

	if (m_iteration == 0)
		buf << "	highp float field = exp(v_input) + v_input*v_input;\n";
	else if (m_iteration == 1)
		buf << "	highp float field = dot(v_input.xy, v_input.xy) + dot(21.0 * v_input.xx, sin(3.1 * v_input.xy));\n";
	else if (m_iteration == 2)
		buf << "	highp float field = dot(v_input.xy, v_input.xy) + dot(21.0 * v_input.zx, sin(3.1 * v_input.zy));\n";
	else if (m_iteration == 3)
		buf << "	highp float field = dot(v_input.xy, v_input.zw) + dot(21.0 * v_input.zy, sin(3.1 * v_input.zw));\n";
	else if (m_iteration == 4)
		buf << "	highp float field = dot(vec2(v_input[0], v_input[1]), vec2(v_input[0], v_input[1])) + dot(21.0 * vec2(v_input[0]), sin(3.1 * vec2(v_input[0], v_input[1])));\n";
	else if (m_iteration == 5)
		buf << "	highp float field = dot(vec2(v_input.a, v_input.b), vec2(v_input.a, v_input.b)) + dot(21.0 * vec2(v_input.a), sin(3.1 * vec2(v_input.a, v_input.b)));\n";
	else
		DE_ASSERT(false);

	buf <<	"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
			"\n"
			"	if (fract(field) > 0.5)\n"
			"		fragColor = vec4(0.0, 0.0, 0.0, 1.0);\n"
			"}";

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}